

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<double>_>::copyValueFrom
          (TypedAttribute<Imath_2_5::Matrix44<double>_> *this,Attribute *other)

{
  TypedAttribute<Imath_2_5::Matrix44<double>_> *pTVar1;
  long in_RDI;
  
  pTVar1 = cast((Attribute *)0x131c01);
  Imath_2_5::Matrix44<double>::operator=((Matrix44<double> *)(in_RDI + 8),&pTVar1->_value);
  return;
}

Assistant:

void		
TypedAttribute<T>::copyValueFrom (const Attribute &other)
{
    _value = cast(other)._value;
}